

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcWindow::IfcWindow(IfcWindow *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcWindow";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__007a9a68);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7a9938;
  *(undefined8 *)&this->field_0x178 = 0x7a9a50;
  *(undefined8 *)&this->field_0x88 = 0x7a9960;
  *(undefined8 *)&this->field_0x98 = 0x7a9988;
  *(undefined8 *)&this->field_0xd0 = 0x7a99b0;
  *(undefined8 *)&this->field_0x100 = 0x7a99d8;
  *(undefined8 *)&this->field_0x138 = 0x7a9a00;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x7a9a28;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x18 = 0;
  this->field_0x170 = 0;
  return;
}

Assistant:

IfcWindow() : Object("IfcWindow") {}